

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUnate.c
# Opt level: O1

void Abc_NtkPrintUnate(Abc_Ntk_t *pNtk,int fUseBdds,int fUseNaive,int fVerbose)

{
  int *piVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  DdManager *dd;
  void *pvVar5;
  undefined8 uVar6;
  Extra_UnateInfo_t *pEVar7;
  Vec_Ptr_t *pVVar8;
  uint uVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  int iVar13;
  ulong uVar14;
  long lVar15;
  timespec ts;
  timespec local_58;
  long local_48;
  long local_40;
  DdManager *local_38;
  
  if (fUseBdds != 0 || fUseNaive != 0) {
    iVar2 = clock_gettime(3,&local_58);
    if (iVar2 < 0) {
      local_40 = -1;
    }
    else {
      local_40 = local_58.tv_nsec / 1000 + local_58.tv_sec * 1000000;
    }
    dd = (DdManager *)Abc_NtkBuildGlobalBdds(pNtk,10000000,1,1,0,fVerbose);
    if (dd != (DdManager *)0x0) {
      iVar2 = clock_gettime(3,&local_58);
      if (iVar2 < 0) {
        local_48 = -1;
      }
      else {
        local_48 = local_58.tv_nsec / 1000 + local_58.tv_sec * 1000000;
      }
      uVar3 = Cudd_ReadKeys(dd);
      uVar4 = Cudd_ReadDead(dd);
      uVar9 = 0;
      printf("Shared BDD size = %6d nodes.\n",(ulong)(uVar3 - uVar4));
      local_38 = dd;
      if (fUseNaive == 0) {
        Cudd_zddVarsFromBddVars(dd,2);
        pVVar8 = pNtk->vCos;
        uVar3 = 0;
        if (0 < pVVar8->nSize) {
          uVar14 = 0;
          uVar9 = 0;
          do {
            lVar11 = *(long *)(*pVVar8->pArray[uVar14] + 0x1b0);
            if (*(int *)(lVar11 + 4) < 8) goto LAB_0031e2e3;
            piVar1 = *(int **)(*(long *)(lVar11 + 8) + 0x38);
            if (*(void **)(piVar1 + 2) == (void *)0x0) goto LAB_0031e2c4;
            iVar2 = (int)*(long *)((long)pVVar8->pArray[uVar14] + 0x10);
            lVar11 = (long)iVar2;
            iVar10 = *piVar1;
            if (iVar10 <= iVar2) {
              iVar13 = iVar2 + 10;
              if (iVar2 < iVar10 * 2) {
                iVar13 = iVar10 * 2;
              }
              if (iVar10 < iVar13) {
                pvVar5 = realloc(*(void **)(piVar1 + 2),(long)iVar13 * 8);
                *(void **)(piVar1 + 2) = pvVar5;
                memset((void *)((long)pvVar5 + (long)*piVar1 * 8),0,
                       ((long)iVar13 - (long)*piVar1) * 8);
                *piVar1 = iVar13;
              }
            }
            if ((*(long *)(*(long *)(piVar1 + 2) + lVar11 * 8) == 0) &&
               (*(code **)(piVar1 + 8) != (code *)0x0)) {
              uVar6 = (**(code **)(piVar1 + 8))(*(undefined8 *)(piVar1 + 4));
              *(undefined8 *)(*(long *)(piVar1 + 2) + lVar11 * 8) = uVar6;
            }
            pEVar7 = Extra_UnateComputeFast
                               (local_38,*(DdNode **)(*(long *)(piVar1 + 2) + lVar11 * 8));
            if (fVerbose != 0) {
              printf("Out%4d : ",uVar14 & 0xffffffff);
              Extra_UnateInfoPrint(pEVar7);
            }
            uVar3 = uVar3 + pEVar7->nVars;
            uVar9 = uVar9 + pEVar7->nUnate;
            Extra_UnateInfoDissolve(pEVar7);
            uVar14 = uVar14 + 1;
            pVVar8 = pNtk->vCos;
          } while ((long)uVar14 < (long)pVVar8->nSize);
        }
      }
      else {
        pVVar8 = pNtk->vCos;
        uVar3 = 0;
        uVar9 = 0;
        if (0 < pVVar8->nSize) {
          uVar14 = 0;
          uVar3 = 0;
          uVar9 = 0;
          do {
            lVar11 = *(long *)(*pVVar8->pArray[uVar14] + 0x1b0);
            if (*(int *)(lVar11 + 4) < 8) {
LAB_0031e2e3:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                            ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
            }
            piVar1 = *(int **)(*(long *)(lVar11 + 8) + 0x38);
            if (*(void **)(piVar1 + 2) == (void *)0x0) {
LAB_0031e2c4:
              __assert_fail("p->pArrayPtr",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecAtt.h"
                            ,0xf9,"void *Vec_AttEntry(Vec_Att_t *, int)");
            }
            iVar2 = (int)*(long *)((long)pVVar8->pArray[uVar14] + 0x10);
            lVar11 = (long)iVar2;
            iVar10 = *piVar1;
            if (iVar10 <= iVar2) {
              iVar13 = iVar2 + 10;
              if (iVar2 < iVar10 * 2) {
                iVar13 = iVar10 * 2;
              }
              if (iVar10 < iVar13) {
                pvVar5 = realloc(*(void **)(piVar1 + 2),(long)iVar13 * 8);
                *(void **)(piVar1 + 2) = pvVar5;
                memset((void *)((long)pvVar5 + (long)*piVar1 * 8),0,
                       ((long)iVar13 - (long)*piVar1) * 8);
                *piVar1 = iVar13;
              }
            }
            if ((*(long *)(*(long *)(piVar1 + 2) + lVar11 * 8) == 0) &&
               (*(code **)(piVar1 + 8) != (code *)0x0)) {
              uVar6 = (**(code **)(piVar1 + 8))(*(undefined8 *)(piVar1 + 4));
              *(undefined8 *)(*(long *)(piVar1 + 2) + lVar11 * 8) = uVar6;
            }
            pEVar7 = Extra_UnateComputeSlow
                               (local_38,*(DdNode **)(*(long *)(piVar1 + 2) + lVar11 * 8));
            if (fVerbose != 0) {
              printf("Out%4d : ",uVar14 & 0xffffffff);
              Extra_UnateInfoPrint(pEVar7);
            }
            uVar3 = uVar3 + pEVar7->nVars;
            uVar9 = uVar9 + pEVar7->nUnate;
            Extra_UnateInfoDissolve(pEVar7);
            uVar14 = uVar14 + 1;
            pVVar8 = pNtk->vCos;
          } while ((long)uVar14 < (long)pVVar8->nSize);
        }
      }
      lVar11 = local_48 - local_40;
      iVar2 = clock_gettime(3,&local_58);
      lVar15 = -1;
      lVar12 = -1;
      if (-1 < iVar2) {
        lVar12 = local_58.tv_nsec / 1000 + local_58.tv_sec * 1000000;
      }
      lVar12 = lVar12 - local_48;
      iVar2 = 0x997dfa;
      printf("Ins/Outs = %4d/%4d.  Total supp = %5d.  Total unate = %5d.\n",
             (ulong)(uint)pNtk->vCis->nSize,(ulong)(uint)pNtk->vCos->nSize,(ulong)uVar3,(ulong)uVar9
            );
      Abc_Print(iVar2,"%s =","Glob BDDs");
      Abc_Print(iVar2,"%9.2f sec\n",(double)lVar11 / 1000000.0);
      Abc_Print(iVar2,"%s =","Unateness");
      Abc_Print(iVar2,"%9.2f sec\n",(double)lVar12 / 1000000.0);
      Abc_Print(iVar2,"%s =","Total    ");
      iVar10 = 3;
      iVar2 = clock_gettime(3,&local_58);
      if (-1 < iVar2) {
        lVar15 = local_58.tv_nsec / 1000 + local_58.tv_sec * 1000000;
      }
      Abc_Print(iVar10,"%9.2f sec\n",(double)(lVar15 - local_40) / 1000000.0);
      Abc_NtkFreeGlobalBdds(pNtk,1);
    }
  }
  return;
}

Assistant:

void Abc_NtkPrintUnate( Abc_Ntk_t * pNtk, int fUseBdds, int fUseNaive, int fVerbose )
{
    if ( fUseBdds || fUseNaive )
        Abc_NtkPrintUnateBdd( pNtk, fUseNaive, fVerbose );
    else
        Abc_NtkPrintUnateSat( pNtk, fVerbose );
}